

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O2

int coda_sp3_reopen(coda_product **product)

{
  coda_product *product_00;
  int iVar1;
  coda_product *product_01;
  char *pcVar2;
  
  iVar1 = sp3_init();
  if (iVar1 == 0) {
    product_01 = (coda_product *)malloc(0x48);
    if (product_01 == (coda_product *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x48,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-sp3.c"
                     ,0x79a);
    }
    else {
      product_00 = *product;
      product_01->file_size = product_00->file_size;
      product_01->format = coda_format_sp3;
      product_01->root_type = (coda_dynamic_type *)0x0;
      product_01->product_definition = (coda_product_definition *)0x0;
      product_01->product_variable_size = (long *)0x0;
      product_01->product_variable = (int64_t **)0x0;
      product_01->mem_size = 0;
      product_01->mem_ptr = (uint8_t *)0x0;
      pcVar2 = strdup(product_00->filename);
      product_01->filename = pcVar2;
      if (pcVar2 != (char *)0x0) {
        coda_close(product_00);
        iVar1 = read_file(product_01);
        if (iVar1 == 0) {
          *product = product_01;
          return 0;
        }
        goto LAB_00154449;
      }
      coda_set_error(-1,"out of memory (could not duplicate filename string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-sp3.c"
                     ,0x7ac);
      coda_close(product_01);
    }
    coda_close(*product);
  }
  else {
    product_01 = *product;
LAB_00154449:
    coda_close(product_01);
  }
  return -1;
}

Assistant:

int coda_sp3_reopen(coda_product **product)
{
    coda_product *product_file;

    if (sp3_init() != 0)
    {
        coda_close(*product);
        return -1;
    }

    product_file = (coda_product *)malloc(sizeof(coda_product));
    if (product_file == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       sizeof(coda_product), __FILE__, __LINE__);
        coda_close(*product);
        return -1;
    }
    product_file->filename = NULL;
    product_file->file_size = (*product)->file_size;
    product_file->format = coda_format_sp3;
    product_file->root_type = NULL;
    product_file->product_definition = NULL;
    product_file->product_variable_size = NULL;
    product_file->product_variable = NULL;
    product_file->mem_size = 0;
    product_file->mem_ptr = NULL;

    product_file->filename = strdup((*product)->filename);
    if (product_file->filename == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate filename string) (%s:%u)",
                       __FILE__, __LINE__);
        coda_close(product_file);
        coda_close(*product);
        return -1;
    }

    coda_close(*product);

    /* create root type */
    if (read_file(product_file) != 0)
    {
        coda_close(product_file);
        return -1;
    }

    *product = (coda_product *)product_file;

    return 0;
}